

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void am_select_line_part_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Wrapper *value;
  Am_Object scroll_menu;
  Am_Object script_line_part;
  Am_Object inter;
  Am_Value_List sel_list;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Value_List local_18;
  
  pAVar1 = Am_Object::Get(cmd,0x170,0);
  Am_Object::Am_Object(&local_20,pAVar1);
  pAVar1 = Am_Object::Get(cmd,0x16d,0);
  Am_Object::Am_Object(&local_28,pAVar1);
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)&local_20,10);
  clear_all_line_same(&local_30);
  Am_Object::Set(&local_30,0x169,false,0);
  find_and_set_other_lines_with_same((Am_Object *)&local_18,&local_28);
  value = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_18);
  Am_Object::Set(&local_30,0x171,value,1);
  Am_Value_List::~Am_Value_List(&local_18);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_select_line_part, (Am_Object cmd))
{
  Am_Object inter = cmd.Get(Am_SAVED_OLD_OWNER);
  Am_Object script_line_part = cmd.Get(Am_OBJECT_MODIFIED);
  Am_Object scroll_menu = inter.Get_Owner();
  clear_all_line_same(scroll_menu);
  scroll_menu.Set(Am_VALUE, false);
  Am_Value_List sel_list =
      find_and_set_other_lines_with_same(script_line_part, scroll_menu);
  scroll_menu.Set(Am_SAVED_OLD_OBJECT_OWNER, sel_list, Am_OK_IF_NOT_THERE);
}